

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O1

void Io_BlifFree(Io_BlifMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  if (p->pAig != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pAig);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p->pObjects != (Io_BlifObj_t *)0x0) {
    free(p->pObjects);
    p->pObjects = (Io_BlifObj_t *)0x0;
  }
  if (p->pTable != (Io_BlifObj_t **)0x0) {
    free(p->pTable);
    p->pTable = (Io_BlifObj_t **)0x0;
  }
  pVVar1 = p->vLines;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vInputs;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vOutputs;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLatches;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vNames;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTokens;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPis;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPos;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLis;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLos;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Io_BlifMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

static void Io_BlifFree( Io_BlifMan_t * p )
{
    if ( p->pAig )
        Abc_NtkDelete( p->pAig );
    if ( p->pBuffer )  ABC_FREE( p->pBuffer );
    if ( p->pObjects ) ABC_FREE( p->pObjects );
    if ( p->pTable )   ABC_FREE( p->pTable );
    Vec_PtrFree( p->vLines );
    Vec_PtrFree( p->vInputs );
    Vec_PtrFree( p->vOutputs );
    Vec_PtrFree( p->vLatches );
    Vec_PtrFree( p->vNames );
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Vec_PtrFree( p->vLis );
    Vec_PtrFree( p->vLos );
    ABC_FREE( p );
}